

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

void vkt::tessellation::anon_unknown_0::InvariantOuterEdge::logOuterTessellationLevel
               (TestLog *log,float tessLevel,OuterEdgeDescription *edgeDesc)

{
  ostringstream *this;
  string local_1b0;
  MessageBuilder local_190;
  
  this = &local_190.m_str;
  local_190.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"Testing with outer tessellation level ");
  std::ostream::operator<<(this,tessLevel);
  std::operator<<((ostream *)this," for the ");
  tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
            (&local_1b0,edgeDesc);
  std::operator<<((ostream *)this,(string *)&local_1b0);
  std::operator<<((ostream *)this,
                  " edge, and with various levels for other edges, and with all programs");
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

void logOuterTessellationLevel (tcu::TestLog& log, const float tessLevel, const OuterEdgeDescription& edgeDesc)
{
	log << tcu::TestLog::Message
		<< "Testing with outer tessellation level " << tessLevel << " for the " << edgeDesc.description() << " edge, and with various levels for other edges, and with all programs"
		<< tcu::TestLog::EndMessage;
}